

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

Own<capnp::compiler::NodeTranslator::BrandScope> __thiscall
capnp::compiler::NodeTranslator::BrandScope::pop(BrandScope *this,uint64_t newLeafId)

{
  Own<capnp::compiler::NodeTranslator::BrandScope> *this_00;
  BrandScope *pBVar1;
  long in_RDX;
  Own<capnp::compiler::NodeTranslator::BrandScope> OVar2;
  Own<capnp::compiler::NodeTranslator::BrandScope> *p;
  uint64_t newLeafId_local;
  BrandScope *this_local;
  
  newLeafId_local = newLeafId;
  this_local = this;
  if (*(long *)(newLeafId + 0x28) == in_RDX) {
    OVar2 = kj::addRef<capnp::compiler::NodeTranslator::BrandScope>
                      ((kj *)this,(BrandScope *)newLeafId);
    pBVar1 = OVar2.ptr;
  }
  else {
    this_00 = kj::_::readMaybe<capnp::compiler::NodeTranslator::BrandScope>
                        ((Maybe<kj::Own<capnp::compiler::NodeTranslator::BrandScope>_> *)
                         (newLeafId + 0x18));
    if (this_00 == (Own<capnp::compiler::NodeTranslator::BrandScope> *)0x0) {
      OVar2 = kj::
              refcounted<capnp::compiler::NodeTranslator::BrandScope,capnp::compiler::ErrorReporter&,unsigned_long&>
                        ((kj *)this,*(ErrorReporter **)(newLeafId + 0x10),(unsigned_long *)&p);
      pBVar1 = OVar2.ptr;
    }
    else {
      pBVar1 = kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator->(this_00);
      OVar2 = pop(this,(uint64_t)pBVar1);
      pBVar1 = OVar2.ptr;
    }
  }
  OVar2.ptr = pBVar1;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

kj::Own<BrandScope> pop(uint64_t newLeafId) {
    if (leafId == newLeafId) {
      return kj::addRef(*this);
    }
    KJ_IF_MAYBE(p, parent) {
      return (*p)->pop(newLeafId);
    } else {
      // Looks like we're moving into a whole top-level scope.
      return kj::refcounted<BrandScope>(errorReporter, newLeafId);
    }